

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void utf8_suite::test_FC_80_80_80_80_7F(void)

{
  char input [9];
  decoder_type decoder;
  undefined4 local_160;
  value local_15c;
  value_type local_158 [16];
  basic_decoder<char> local_148;
  
  local_148.input.tail = local_158 + 8;
  local_158[0] = '\"';
  local_158[1] = -4;
  local_158[2] = -0x80;
  local_158[3] = -0x80;
  local_158[4] = -0x80;
  local_158[5] = -0x80;
  local_158[6] = '\x7f';
  local_158[7] = '\"';
  local_158[8] = 0;
  local_148.input.head = local_158;
  memset(&local_148.current,0,0x120);
  local_148.current.code = uninitialized;
  local_148.current.view.head = (const_pointer)0x0;
  local_148.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_148);
  local_15c = local_148.current.code;
  local_160 = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x890,"void utf8_suite::test_FC_80_80_80_80_7F()",&local_15c,&local_160);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[7]>
            ("decoder.literal()","\"\\\"\\xFC\\x80\\x80\\x80\\x80\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x891,"void utf8_suite::test_FC_80_80_80_80_7F()",&local_148.current.view,
             anon_var_dwarf_6eab);
  return;
}

Assistant:

void test_FC_80_80_80_80_7F()
{
    const char input[] = "\"\xFC\x80\x80\x80\x80\x7F\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::error_unexpected_token);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal(), "\"\xFC\x80\x80\x80\x80");
}